

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClipperTests.cpp
# Opt level: O3

string * agge::tests::ClipperTests::__suite_id_abi_cxx11_(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/ClipperTests.cpp"
             ,"");
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"13","");
  std::operator+(&local_40,&local_60,&local_80);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"ClipperTests","");
  std::operator+(in_RDI,&local_40,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  return in_RDI;
}

Assistant:

test( YClippingFlagsAreCalculatedAccordinglyToTheBox )
			{
				// INIT
				rect<int> box1 = { 10, -100, 100, 1000 };
				rect<real_t> box2 = { -10.3f, 5.2f, -3.1f, 17.7f };

				// ACT / ASSERT
				assert_equal(y1_clipped, clipping_y(-101, box1));
				assert_equal(0, clipping_y(-100, box1));
				assert_equal(0, clipping_y(1000, box1));
				assert_equal(y2_clipped, clipping_y(1001, box1));
				assert_equal(y1_clipped, clipping_y(static_cast<real_t>(5.199f), box2));
				assert_equal(y2_clipped, clipping_y(static_cast<real_t>(17.7001f), box2));
			}